

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::Base64Test_rejectInvalidPadding_Test::TestBody
          (Base64Test_rejectInvalidPadding_Test *this)

{
  bool bVar1;
  AssertHelper local_80;
  Message local_78;
  allocator local_69;
  string local_68 [32];
  detail local_48 [55];
  byte local_11;
  Base64Test_rejectInvalidPadding_Test *pBStack_10;
  bool gtest_caught_any;
  Base64Test_rejectInvalidPadding_Test *this_local;
  
  pBStack_10 = this;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_11 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_68,"A===",&local_69);
      detail::base64_decode(local_48,(string *)local_68);
      ::std::__cxx11::string::~string((string *)local_48);
      ::std::__cxx11::string::~string(local_68);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_69);
    }
    if ((local_11 & 1) != 0) {
      return;
    }
  }
  testing::Message::Message(&local_78);
  testing::internal::AssertHelper::AssertHelper
            (&local_80,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/util/tests/unit/base64_test.cc"
             ,0x4a,
             "Expected: detail::base64_decode(\"A===\") throws an exception.\n  Actual: it doesn\'t."
            );
  testing::internal::AssertHelper::operator=(&local_80,&local_78);
  testing::internal::AssertHelper::~AssertHelper(&local_80);
  testing::Message::~Message(&local_78);
  return;
}

Assistant:

TEST(Base64Test, rejectInvalidPadding) {
  EXPECT_ANY_THROW(detail::base64_decode("A==="));
}